

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O3

int pkey_gost_omac_ctrl_str(EVP_PKEY_CTX *ctx,char *type,char *value,size_t max_size)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  undefined8 *ptr;
  undefined2 *puVar7;
  int reason;
  long keylen;
  char *local_20;
  
  iVar4 = strcmp(type,"key");
  if (iVar4 == 0) {
    sVar6 = strlen(value);
    if (sVar6 == 0x20) {
      puVar7 = (undefined2 *)EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)ctx);
      uVar1 = *(undefined8 *)(value + 8);
      uVar2 = *(undefined8 *)(value + 0x10);
      uVar3 = *(undefined8 *)(value + 0x18);
      *(undefined8 *)(puVar7 + 8) = *(undefined8 *)value;
      *(undefined8 *)(puVar7 + 0xc) = uVar1;
      *(undefined8 *)(puVar7 + 0x10) = uVar2;
      *(undefined8 *)(puVar7 + 0x14) = uVar3;
      *puVar7 = 1;
      return 1;
    }
    reason = 0x72;
    iVar4 = 0x36e;
  }
  else {
    iVar4 = strcmp(type,"hexkey");
    if (iVar4 == 0) {
      ptr = (undefined8 *)OPENSSL_hexstr2buf(value,&local_20);
      if ((ptr != (undefined8 *)0x0) && (local_20 == (char *)0x20)) {
        puVar7 = (undefined2 *)EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)ctx);
        uVar1 = ptr[1];
        uVar2 = ptr[2];
        uVar3 = ptr[3];
        *(undefined8 *)(puVar7 + 8) = *ptr;
        *(undefined8 *)(puVar7 + 0xc) = uVar1;
        *(undefined8 *)(puVar7 + 0x10) = uVar2;
        *(undefined8 *)(puVar7 + 0x14) = uVar3;
        *puVar7 = 1;
        CRYPTO_free(ptr);
        return 1;
      }
      ERR_GOST_error(0x8c,0x72,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_pmeth.c"
                     ,0x37a);
      CRYPTO_free(ptr);
      return 0;
    }
    iVar4 = strcmp(type,"size");
    if (iVar4 != 0) {
      return -2;
    }
    lVar5 = strtol(value,&local_20,10);
    if (*local_20 == '\0') {
      iVar4 = pkey_gost_omac_ctrl(ctx,0x1005,(int)lVar5,(void *)0x0,8);
      return iVar4;
    }
    reason = 0x75;
    iVar4 = 0x387;
  }
  ERR_GOST_error(0x8c,reason,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_pmeth.c"
                 ,iVar4);
  return 0;
}

Assistant:

static int pkey_gost_omac_ctrl_str(EVP_PKEY_CTX *ctx,
                                  const char *type, const char *value, size_t max_size)
{
    if (strcmp(type, key_ctrl_string) == 0) {
        if (strlen(value) != 32) {
            GOSTerr(GOST_F_PKEY_GOST_OMAC_CTRL_STR,
                    GOST_R_INVALID_MAC_KEY_LENGTH);
            return 0;
        }
        return pkey_gost_mac_ctrl(ctx, EVP_PKEY_CTRL_SET_MAC_KEY,
                                  32, (char *)value);
    }
    if (strcmp(type, hexkey_ctrl_string) == 0) {
        long keylen;
        int ret;
        unsigned char *keybuf = string_to_hex(value, &keylen);
        if (!keybuf || keylen != 32) {
            GOSTerr(GOST_F_PKEY_GOST_OMAC_CTRL_STR,
                    GOST_R_INVALID_MAC_KEY_LENGTH);
            OPENSSL_free(keybuf);
            return 0;
        }
        ret = pkey_gost_mac_ctrl(ctx, EVP_PKEY_CTRL_SET_MAC_KEY, 32, keybuf);
        OPENSSL_free(keybuf);
        return ret;

    }
    if (!strcmp(type, maclen_ctrl_string)) {
        char *endptr;
        long size = strtol(value, &endptr, 10);
        if (*endptr != '\0') {
            GOSTerr(GOST_F_PKEY_GOST_OMAC_CTRL_STR, GOST_R_INVALID_MAC_SIZE);
            return 0;
        }
        return pkey_gost_omac_ctrl(ctx, EVP_PKEY_CTRL_MAC_LEN, size, NULL, max_size);
    }
    return -2;
}